

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O1

void __thiscall
cmDependsFortran::MatchRemoteModules(cmDependsFortran *this,istream *fin,string *stampDir)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  size_t len;
  bool bVar5;
  string mod;
  string line;
  long *local_98;
  ulong local_90;
  long local_88 [2];
  string *local_78;
  string local_70;
  string local_50;
  
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  bVar5 = false;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  do {
    do {
      while( true ) {
        do {
          do {
            bVar3 = cmsys::SystemTools::GetLineFromStream(fin,&local_70,(bool *)0x0,-1);
            if (!bVar3) {
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,
                                CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                         local_70.field_2._M_local_buf[0]) + 1);
              }
              return;
            }
          } while (local_70._M_string_length == 0);
          cVar1 = *local_70._M_dataplus._M_p;
        } while ((cVar1 == '\r') || (cVar1 == '#'));
        if (cVar1 == ' ') break;
        iVar4 = std::__cxx11::string::compare((char *)&local_70);
        bVar5 = iVar4 == 0;
      }
    } while (!bVar5);
    local_98 = local_88;
    local_78 = stampDir;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    uVar2 = local_90;
    if (local_90 < 4) {
LAB_003cb047:
      if (4 < uVar2) {
        iVar4 = strcmp((char *)((long)local_98 + (uVar2 - 5)),".smod");
        if (iVar4 == 0) goto LAB_003cb078;
      }
      std::__cxx11::string::append((char *)&local_98);
    }
    else {
      iVar4 = strcmp((char *)((long)local_98 + (local_90 - 4)),".mod");
      if (iVar4 != 0) goto LAB_003cb047;
    }
LAB_003cb078:
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_98);
    stampDir = local_78;
    ConsiderModule(this,&local_50,local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
  } while( true );
}

Assistant:

void cmDependsFortran::MatchRemoteModules(std::istream& fin,
                                          const std::string& stampDir)
{
  std::string line;
  bool doing_provides = false;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    // Ignore comments and empty lines.
    if (line.empty() || line[0] == '#' || line[0] == '\r') {
      continue;
    }

    if (line[0] == ' ') {
      if (doing_provides) {
        std::string mod = line;
        if (!cmHasLiteralSuffix(mod, ".mod") &&
            !cmHasLiteralSuffix(mod, ".smod")) {
          // Support fortran.internal files left by older versions of CMake.
          // They do not include the ".mod" extension.
          mod += ".mod";
        }
        this->ConsiderModule(mod.substr(1), stampDir);
      }
    } else if (line == "provides") {
      doing_provides = true;
    } else {
      doing_provides = false;
    }
  }
}